

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t * PAL_wcspbrk(char16_t *string,char16_t *strCharSet)

{
  char16_t *pcVar1;
  char16_t *strCharSet_local;
  char16_t *string_local;
  
  strCharSet_local = string;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  while( true ) {
    if (*strCharSet_local == L'\0') {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        return (char16_t *)0x0;
      }
      abort();
    }
    pcVar1 = PAL_wcschr(strCharSet,*strCharSet_local);
    if (pcVar1 != (char16_t *)0x0) break;
    strCharSet_local = strCharSet_local + 1;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return strCharSet_local;
  }
  abort();
}

Assistant:

const char16_t *
__cdecl
PAL_wcspbrk(
        const char16_t *string,
        const char16_t *strCharSet)
{
    PERF_ENTRY(wcspbrk);
    ENTRY("wcspbrk (string=%p (%S), strCharSet=%p (%S))\n",
          string?string:W16_NULLSTRING,
          string?string:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING);

    while (*string)
    {
        if (PAL_wcschr(strCharSet, *string) != NULL)
        {
            LOGEXIT("wcspbrk returning char16_t %p (%S)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING);
            PERF_EXIT(wcspbrk);
            return (char16_t *) string;
        }

        string++;
    }

    LOGEXIT("wcspbrk returning char16_t NULL\n");
    PERF_EXIT(wcspbrk);
    return NULL;
}